

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic-base.hxx
# Opt level: O2

void __thiscall lineage::heuristics::HeuristicBase::logObj(HeuristicBase *this)

{
  long lVar1;
  Data *pDVar2;
  ostream *poVar3;
  rep rVar4;
  double extraout_XMM0_Qa;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_3b8;
  stringstream stream;
  ofstream file;
  
  if (this->silent_ == false) {
    levinkov::Timer::stop(&this->data_->timer);
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar3 = std::ostream::_M_insert<double>((this->data_->timer).m_seconds);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"inf ");
    lVar1 = *(long *)poVar3;
    *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 8) = 10;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar3 + lVar1 + 0x18) = *(uint *)(poVar3 + lVar1 + 0x18) & 0xfffffefb | 4;
    (*this->_vptr_HeuristicBase[2])(this);
    poVar3 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"nan");
    poVar3 = std::operator<<(poVar3," 0 0 0");
    poVar3 = std::operator<<(poVar3," 0 0 0");
    std::operator<<(poVar3," 0 0\n");
    std::operator+(&bStack_3b8,&this->data_->solutionName,"-optimization-log.txt");
    std::ofstream::ofstream(&file,(string *)&bStack_3b8,_S_out|_S_app);
    std::__cxx11::string::~string((string *)&bStack_3b8);
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)&file,(string *)&bStack_3b8);
    std::__cxx11::string::~string((string *)&bStack_3b8);
    std::ofstream::close();
    std::ofstream::~ofstream(&file);
    pDVar2 = this->data_;
    rVar4 = std::chrono::_V2::system_clock::now();
    (pDVar2->timer).m_timeObject.__d.__r = rVar4;
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  }
  return;
}

Assistant:

inline void
HeuristicBase::logObj() const
{
    if (silent_)
        return;

    data_.timer.stop(); // dont time log-IO

    std::stringstream stream;
    stream << data_.timer.get_elapsed_seconds() << " "
           << "inf " // bound
           << std::setprecision(10) << std::fixed << getObjective()
           << " "      // objBest
           << "nan"    // gap
           << " 0 0 0" // violated constraints;
           << " 0 0 0" // termination/birth/bifuraction constr.
           << " 0 0\n";

    {
        std::ofstream file(data_.solutionName + "-optimization-log.txt",
                           std::ofstream::out | std::ofstream::app);
        file << stream.str();
        file.close();
    }

    data_.timer.start();
}